

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.c
# Opt level: O0

void replay(void)

{
  nh_bool nVar1;
  int iVar2;
  wchar_t wVar3;
  fnchar **__ptr;
  nh_menuitem_conflict *pnVar4;
  char *title;
  fnchar **local_940;
  wchar_t local_934;
  fnchar **local_930;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  nh_game_info gi;
  nh_log_status status;
  int pick [1];
  int filecount;
  int size;
  int icount;
  int fd;
  int n;
  int i;
  nh_menuitem *items;
  fnchar **files;
  fnchar *dir;
  fnchar filename [1024];
  fnchar savedir [256];
  fnchar logdir [256];
  char buf [256];
  
  nVar1 = get_gamedir(LOG_DIR,savedir + 0xf8);
  if (nVar1 == '\0') {
    savedir[0xf8] = '\0';
  }
  nVar1 = get_gamedir(SAVE_DIR,filename + 0x3f8);
  if (nVar1 == '\0') {
    filename[0x3f8] = '\0';
  }
  if (savedir[0xf8] == '\0') {
    if (filename[0x3f8] == '\0') {
      curses_msgwin("There are no games to replay.");
      return;
    }
    files = (fnchar **)(filename + 0x3f8);
  }
  else {
    files = (fnchar **)(savedir + 0xf8);
  }
  while( true ) {
    while( true ) {
      dir._0_1_ = 0;
      __ptr = list_gamefiles((char *)files,&status);
      if (status != LS_SAVED) break;
      if (files == (fnchar **)(filename + 0x3f8)) {
        curses_msgwin("There are no saved games to replay.");
        filename[0x3f8] = '\0';
      }
      else {
        curses_msgwin("There are no completed games to replay.");
        savedir[0xf8] = '\0';
      }
      if (files == (fnchar **)(filename + 0x3f8)) {
        local_930 = (fnchar **)(savedir + 0xf8);
      }
      else {
        local_930 = (fnchar **)(filename + 0x3f8);
      }
      files = local_930;
      if (*(char *)local_930 == '\0') {
        return;
      }
    }
    filecount = 0;
    pick[0] = status + LS_IN_PROGRESS;
    _n = (nh_menuitem_conflict *)malloc((long)pick[0] * 0x10c);
    if ((files == (fnchar **)(savedir + 0xf8)) && (filename[0x3f8] != '\0')) {
      if (pick[0] < 1) {
        pick[0] = pick[0] << 1;
        _n = (nh_menuitem_conflict *)realloc(_n,(long)pick[0] * 0x10c);
      }
      _n->id = L'\xffffffff';
      _n->role = MI_NORMAL;
      _n->accel = '!';
      _n->group_accel = '\0';
      _n->selected = '\0';
      strcpy(_n->caption,"View saved games instead");
      if (pick[0] < 2) {
        pick[0] = pick[0] << 1;
        _n = (nh_menuitem_conflict *)realloc(_n,(long)pick[0] * 0x10c);
      }
      _n[1].id = L'\0';
      _n[1].role = MI_NORMAL;
      _n[1].accel = '\0';
      _n[1].group_accel = '\0';
      _n[1].selected = '\0';
      strcpy(_n[1].caption,"");
      filecount = 2;
    }
    else if ((files == (fnchar **)(filename + 0x3f8)) && (savedir[0xf8] != '\0')) {
      if (pick[0] < 1) {
        pick[0] = pick[0] << 1;
        _n = (nh_menuitem_conflict *)realloc(_n,(long)pick[0] * 0x10c);
      }
      _n->id = L'\xffffffff';
      _n->role = MI_NORMAL;
      _n->accel = '!';
      _n->group_accel = '\0';
      _n->selected = '\0';
      strcpy(_n->caption,"View completed games instead");
      if (pick[0] < 2) {
        pick[0] = pick[0] << 1;
        _n = (nh_menuitem_conflict *)realloc(_n,(long)pick[0] * 0x10c);
      }
      _n[1].id = L'\0';
      _n[1].role = MI_NORMAL;
      _n[1].accel = '\0';
      _n[1].group_accel = '\0';
      _n[1].selected = '\0';
      strcpy(_n[1].caption,"");
      filecount = 2;
    }
    for (fd = 0; fd < status; fd = fd + 1) {
      iVar2 = open(__ptr[fd],2,0x1b0);
      gi.death._251_4_ = nh_get_savegame_status(iVar2,&_item_);
      close(iVar2);
      describe_game(logdir + 0xf8,gi.death._251_4_,(nh_game_info *)&_item_);
      if (pick[0] <= filecount) {
        pick[0] = pick[0] << 1;
        _n = (nh_menuitem_conflict *)realloc(_n,(long)pick[0] * 0x10c);
      }
      pnVar4 = _n + filecount;
      if (gi.death._251_4_ == 2) {
        local_934 = L'\0';
      }
      else {
        local_934 = fd + L'\x01';
      }
      pnVar4->id = local_934;
      pnVar4->role = MI_NORMAL;
      pnVar4->accel = '\0';
      pnVar4->group_accel = '\0';
      pnVar4->selected = '\0';
      strcpy(pnVar4->caption,logdir + 0xf8);
      filecount = filecount + 1;
    }
    title = "Pick a completed game to view";
    if (files == (fnchar **)(filename + 0x3f8)) {
      title = "Pick a saved game to view";
    }
    wVar3 = curses_display_menu(_n,filecount,title,L'\x01',(wchar_t *)(gi.death + 0xff));
    free(_n);
    dir._0_1_ = 0;
    if ((L'\0' < wVar3) && (gi._444_4_ != -1)) {
      strncat((char *)&dir,__ptr[gi._444_4_ + -1],0x3ff);
    }
    for (fd = 0; fd < status; fd = fd + 1) {
      free(__ptr[fd]);
    }
    free(__ptr);
    if (wVar3 < L'\x01') break;
    if (gi._444_4_ != -1) {
      iVar2 = open((char *)&dir,2,0x1b0);
      replay_commandloop(iVar2);
      close(iVar2);
      return;
    }
    if (files == (fnchar **)(filename + 0x3f8)) {
      local_940 = (fnchar **)(savedir + 0xf8);
    }
    else {
      local_940 = (fnchar **)(filename + 0x3f8);
    }
    files = local_940;
  }
  return;
}

Assistant:

void replay(void)
{
    char buf[BUFSZ];
    fnchar logdir[BUFSZ], savedir[BUFSZ], filename[1024], *dir, **files;
    struct nh_menuitem *items;
    int i, n, fd, icount, size, filecount, pick[1];
    enum nh_log_status status;
    struct nh_game_info gi;
    
    if (!get_gamedir(LOG_DIR, logdir))	logdir[0] = '\0';
    if (!get_gamedir(SAVE_DIR, savedir))savedir[0] = '\0';
    
    if (*logdir)	dir = logdir;
    else if (*savedir)	dir = savedir;
    else {
	curses_msgwin("There are no games to replay.");
	return;
    }
    
    while (1) {
	filename[0] = '\0';
	files = list_gamefiles(dir, &filecount);
	/* make sure there are some files to show */
	if (!filecount) {
	    if (dir == savedir) {
		curses_msgwin("There are no saved games to replay.");
		savedir[0] = '\0';
	    } else {
		curses_msgwin("There are no completed games to replay.");
		logdir[0] = '\0';
	    }
	    
	    dir = (dir == savedir) ? logdir : savedir;
	    if (!*dir) return;
	    continue;
	}
	
	icount = 0;
	size = filecount + 2;
	items = malloc(size * sizeof(struct nh_menuitem));

	if (dir == logdir && *savedir) {
	    add_menu_item(items, size, icount, -1,
			  "View saved games instead", '!', FALSE);
	    add_menu_txt(items, size, icount, "", MI_NORMAL);
	} else if (dir == savedir && *logdir) {
	    add_menu_item(items, size, icount, -1,
			  "View completed games instead", '!', FALSE);
	    add_menu_txt(items, size, icount, "", MI_NORMAL);
	}

	/* add all the files to the menu */
	for (i = 0; i < filecount; i++) {
	    fd = sys_open(files[i], O_RDWR, 0660);
	    status = nh_get_savegame_status(fd, &gi);
	    close(fd);
	    
	    describe_game(buf, status, &gi);
	    add_menu_item(items, size, icount,
			    (status == LS_IN_PROGRESS) ? 0 : i + 1,
			    buf, 0, FALSE);
	}

	n = curses_display_menu(items, icount,
				(dir == savedir ?
				 "Pick a saved game to view" :
				 "Pick a completed game to view"),
				PICK_ONE, pick);
	free(items);
	filename[0] = '\0';
	if (n > 0 && pick[0] != -1)
	    fnncat(filename, files[pick[0]-1], sizeof(filename)/sizeof(fnchar)-1);
	
	for (i = 0; i < filecount; i++)
	    free(files[i]);
	free(files);
	
	if (n <= 0)
	    return;
	
	if (pick[0] == -1) {
	    dir = (dir == savedir) ? logdir : savedir;
	    continue;
	}
	
	/* we have a valid filename */
	break;
    }
    
    fd = sys_open(filename, O_RDWR, 0660);
    replay_commandloop(fd);
    close(fd);
}